

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtable.cpp
# Opt level: O3

void __thiscall FStringTable::FreeData(FStringTable *this)

{
  StringEntry *block;
  StringEntry *pSVar1;
  int i;
  long lVar2;
  
  lVar2 = 0;
  do {
    block = this->Buckets[lVar2];
    this->Buckets[lVar2] = (StringEntry *)0x0;
    while (block != (StringEntry *)0x0) {
      pSVar1 = block->Next;
      M_Free(block);
      block = pSVar1;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x80);
  return;
}

Assistant:

void FStringTable::FreeData ()
{
	for (int i = 0; i < HASH_SIZE; ++i)
	{
		StringEntry *entry = Buckets[i], *next;
		Buckets[i] = NULL;
		while (entry != NULL)
		{
			next = entry->Next;
			M_Free (entry);
			entry = next;
		}
	}
}